

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall DPlaneWatcher::Tick(DPlaneWatcher *this)

{
  int num;
  line_t *line;
  AActor *activator;
  double local_18;
  double newd;
  DPlaneWatcher *this_local;
  
  if (this->Sector == (sector_t *)0x0) {
    (*(this->super_DThinker).super_DObject._vptr_DObject[4])();
  }
  else {
    if ((this->bCeiling & 1U) == 0) {
      local_18 = secplane_t::fD(&this->Sector->floorplane);
    }
    else {
      local_18 = secplane_t::fD(&this->Sector->ceilingplane);
    }
    if (((this->LastD < this->WatchD) && (this->WatchD <= local_18)) ||
       ((this->WatchD <= this->LastD && this->LastD != this->WatchD && (local_18 <= this->WatchD))))
    {
      num = this->Special;
      line = this->Line;
      activator = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->Activator);
      P_ExecuteSpecial(num,line,activator,(bool)(this->LineSide & 1),this->Arg0,this->Arg1,
                       this->Arg2,this->Arg3,this->Arg4);
      (*(this->super_DThinker).super_DObject._vptr_DObject[4])();
    }
  }
  return;
}

Assistant:

void DPlaneWatcher::Tick ()
{
	if (Sector == NULL)
	{
		Destroy ();
		return;
	}

	double newd;

	if (bCeiling)
	{
		newd = Sector->ceilingplane.fD();
	}
	else
	{
		newd = Sector->floorplane.fD();
	}

	if ((LastD < WatchD && newd >= WatchD) ||
		(LastD > WatchD && newd <= WatchD))
	{
		P_ExecuteSpecial(Special, Line, Activator, LineSide, Arg0, Arg1, Arg2, Arg3, Arg4);
		Destroy ();
	}

}